

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayView.h
# Opt level: O1

ArrayView<const_Corrade::Utility::JsonToken> __thiscall
Corrade::Containers::ArrayView<const_Corrade::Utility::JsonToken>::slice
          (ArrayView<const_Corrade::Utility::JsonToken> *this,size_t begin,size_t end)

{
  ArrayView<const_Corrade::Utility::JsonToken> AVar1;
  size_t local_30;
  size_t local_28;
  anon_class_24_3_cb5dd4a3 local_20;
  
  local_30 = end;
  local_28 = begin;
  if ((end < begin) || (this->_size < end)) {
    local_20.begin = &local_28;
    local_20.end = &local_30;
    local_20.this = this;
    slice::anon_class_24_3_cb5dd4a3::operator()(&local_20);
  }
  AVar1._data = this->_data + local_28;
  AVar1._size = local_30 - local_28;
  return AVar1;
}

Assistant:

constexpr ArrayView<T> ArrayView<T>::slice(std::size_t begin, std::size_t end) const {
    return CORRADE_CONSTEXPR_DEBUG_ASSERT(begin <= end && end <= _size,
            "Containers::ArrayView::slice(): slice ["
            << Utility::Debug::nospace << begin
            << Utility::Debug::nospace << ":"
            << Utility::Debug::nospace << end
            << Utility::Debug::nospace << "] out of range for" << _size
            << "elements"),
        ArrayView<T>{_data + begin, end - begin};
}